

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O0

void duckdb::BinaryExecutor::
     ExecuteConstant<unsigned_char,_unsigned_char,_bool,_duckdb::BinarySingleArgumentOperatorWrapper,_duckdb::NotEquals,_bool>
               (Vector *left,Vector *right,Vector *result,bool fun)

{
  byte right_00;
  bool bVar1;
  uchar *puVar2;
  uchar *puVar3;
  bool *pbVar4;
  byte in_CL;
  Vector *in_RDX;
  Vector *in_RSI;
  bool in_stack_0000000f;
  bool *result_data;
  uchar *rdata;
  uchar *ldata;
  ValidityMask *in_stack_ffffffffffffffb8;
  uchar left_00;
  uchar fun_00;
  
  right_00 = in_CL & 1;
  Vector::SetVectorType(in_RSI,(VectorType)((ulong)in_RDX >> 0x38));
  puVar2 = ConstantVector::GetData<unsigned_char>((Vector *)0x2cf07f4);
  puVar3 = ConstantVector::GetData<unsigned_char>((Vector *)0x2cf0803);
  pbVar4 = ConstantVector::GetData<bool>((Vector *)0x2cf0812);
  bVar1 = ConstantVector::IsNull((Vector *)0x2cf0821);
  if ((!bVar1) && (bVar1 = ConstantVector::IsNull((Vector *)0x2cf082f), !bVar1)) {
    left_00 = *puVar2;
    fun_00 = *puVar3;
    ConstantVector::Validity(in_RDX);
    bVar1 = BinarySingleArgumentOperatorWrapper::
            Operation<bool,_duckdb::NotEquals,_unsigned_char,_unsigned_char,_bool>
                      ((bool)fun_00,left_00,right_00,in_stack_ffffffffffffffb8,0x2cf0896);
    *pbVar4 = bVar1;
    return;
  }
  ConstantVector::SetNull((Vector *)result_data,in_stack_0000000f);
  return;
}

Assistant:

static void ExecuteConstant(Vector &left, Vector &right, Vector &result, FUNC fun) {
		result.SetVectorType(VectorType::CONSTANT_VECTOR);

		auto ldata = ConstantVector::GetData<LEFT_TYPE>(left);
		auto rdata = ConstantVector::GetData<RIGHT_TYPE>(right);
		auto result_data = ConstantVector::GetData<RESULT_TYPE>(result);

		if (ConstantVector::IsNull(left) || ConstantVector::IsNull(right)) {
			ConstantVector::SetNull(result, true);
			return;
		}
		*result_data = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
		    fun, *ldata, *rdata, ConstantVector::Validity(result), 0);
	}